

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~basic_pbf_writer(basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this)

{
  if (this->m_parent_writer !=
      (basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    close_submessage(this->m_parent_writer);
  }
  return;
}

Assistant:

~basic_pbf_writer() noexcept {
        try {
            if (m_parent_writer != nullptr) {
                m_parent_writer->close_submessage();
            }
        } catch (...) {
            // This try/catch is used to make the destructor formally noexcept.
            // close_submessage() is not noexcept, but will not throw the way
            // it is called here, so we are good. But to be paranoid, call...
            std::terminate();
        }
    }